

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonWriter.cpp
# Opt level: O2

JsonWriter * __thiscall Corrade::Utility::JsonWriter::beginObject(JsonWriter *this)

{
  State *pSVar1;
  Pair<unsigned_long,_unsigned_long> *pPVar2;
  Debug *this_00;
  ostream *poVar3;
  type values;
  Error local_48;
  
  pSVar1 = Containers::Pointer<Corrade::Utility::JsonWriter::State>::operator*(&this->_state);
  if ((pSVar1->expecting < DocumentEnd) && ((0x13U >> (pSVar1->expecting & 0x1f) & 1) != 0)) {
    writeCommaNewlineIndentInternal(this);
    local_48.super_Debug._output = (ostream *)CONCAT71(local_48.super_Debug._output._1_7_,0x7b);
    Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
              (&pSVar1->out,(type_conflict4 *)&local_48);
    pPVar2 = Containers::
             Array<Corrade::Containers::Pair<unsigned_long,_unsigned_long>,_void_(*)(Corrade::Containers::Pair<unsigned_long,_unsigned_long>_*,_unsigned_long)>
             ::back(&pSVar1->levels);
    poVar3 = (ostream *)((pSVar1->indentation)._size + pPVar2->_first);
    local_48.super_Debug._output = poVar3;
    pPVar2 = Containers::
             arrayAppend<Corrade::Containers::Pair<unsigned_long,unsigned_long>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::Pair<unsigned_long,unsigned_long>>,unsigned_long,unsigned_long>
                       (&pSVar1->levels,&local_48);
    if ((pSVar1->whitespace)._size < pPVar2->_first) {
      values._size = (size_t)poVar3;
      values._data = (char *)(pSVar1->indentation)._size;
      Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
                ((Containers *)&pSVar1->whitespace,
                 (Array<char,_void_(*)(char_*,_unsigned_long)> *)(pSVar1->indentation)._data,values)
      ;
    }
    pSVar1->expecting = ObjectKeyOrEnd;
    pSVar1->needsCommaBefore = false;
    return this;
  }
  poVar3 = Error::defaultOutput();
  Error::Error(&local_48,poVar3,(Flags)0x0);
  this_00 = Debug::operator<<(&local_48.super_Debug,"Utility::JsonWriter::beginObject(): expected");
  Debug::operator<<(this_00,*(char **)((anonymous_namespace)::ExpectingString +
                                      (long)(int)pSVar1->expecting * 8));
  Error::~Error(&local_48);
  abort();
}

Assistant:

JsonWriter& JsonWriter::beginObject() {
    State& state = *_state;
    CORRADE_ASSERT(
        state.expecting == Expecting::Value ||
        state.expecting == Expecting::ObjectValue ||
        state.expecting == Expecting::ArrayValueOrArrayEnd,
        "Utility::JsonWriter::beginObject(): expected" << ExpectingString[int(state.expecting)], *this);

    /* Comma, newline and indent, object opening brace */
    writeCommaNewlineIndentInternal();
    arrayAppend(state.out, '{');

    /* Indent next level further; mark this as an object */
    if(arrayAppend(state.levels, InPlaceInit, state.levels.back().first() + state.indentation.size(), ~std::size_t{}).first() > state.whitespace.size())
        arrayAppend(state.whitespace, state.indentation);

    /* Next expectig an object key or end */
    state.expecting = Expecting::ObjectKeyOrEnd;
    state.needsCommaBefore = false;

    return *this;
}